

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O2

void mcu8str_update_size(mcu8str *str)

{
  mcu8str_size_t mVar1;
  
  mVar1 = 0;
  if (1 < (ulong)str->buflen) {
    mVar1 = mctools_strlen(str->c_str,(ulong)str->buflen);
    if (str->buflen <= mVar1) {
      mctools_impl_error("mcu8str_update_size logic error");
    }
  }
  str->size = (uint)mVar1;
  return;
}

Assistant:

void mcu8str_update_size( mcu8str* str )
  {
    if ( str->buflen < 2 ) {
      //This handles not only empty strings, but also the special case of
      //buflen=0, size=0 which occurs after _create_empty or _deallocate:
      str->size = 0;
      assert( str->c_str[0] == '\0' );
      return;
    }
    mcu8str_size_t n = mctools_strlen( str->c_str, str->buflen );
    if ( n >= str->buflen ) {
      mctools_impl_error("mcu8str_update_size logic error");
      //return;
    }
    str->size = (unsigned)n;
  }